

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrjpgcom.c
# Opt level: O0

void usage(void)

{
  fprintf(_stderr,"wrjpgcom inserts a textual comment in a JPEG file.\n");
  fprintf(_stderr,"You can add to or replace any existing comment(s).\n");
  fprintf(_stderr,"Usage: %s [switches] ",progname);
  fprintf(_stderr,"[inputfile]\n");
  fprintf(_stderr,"Switches (names may be abbreviated):\n");
  fprintf(_stderr,"  -replace         Delete any existing comments\n");
  fprintf(_stderr,"  -comment \"text\"  Insert comment with given text\n");
  fprintf(_stderr,"  -cfile name      Read comment from named file\n");
  fprintf(_stderr,"Notice that you must put quotes around the comment text\n");
  fprintf(_stderr,"when you use -comment.\n");
  fprintf(_stderr,"If you do not give either -comment or -cfile on the command line,\n");
  fprintf(_stderr,"then the comment text is read from standard input.\n");
  fprintf(_stderr,"It can be multiple lines, up to %u characters total.\n",65000);
  fprintf(_stderr,"You must specify an input JPEG file name when supplying\n");
  fprintf(_stderr,"comment text from standard input.\n");
  exit(1);
}

Assistant:

static void
usage(void)
/* complain about bad command line */
{
  fprintf(stderr, "wrjpgcom inserts a textual comment in a JPEG file.\n");
  fprintf(stderr, "You can add to or replace any existing comment(s).\n");

  fprintf(stderr, "Usage: %s [switches] ", progname);
#ifdef TWO_FILE_COMMANDLINE
  fprintf(stderr, "inputfile outputfile\n");
#else
  fprintf(stderr, "[inputfile]\n");
#endif

  fprintf(stderr, "Switches (names may be abbreviated):\n");
  fprintf(stderr, "  -replace         Delete any existing comments\n");
  fprintf(stderr, "  -comment \"text\"  Insert comment with given text\n");
  fprintf(stderr, "  -cfile name      Read comment from named file\n");
  fprintf(stderr, "Notice that you must put quotes around the comment text\n");
  fprintf(stderr, "when you use -comment.\n");
  fprintf(stderr, "If you do not give either -comment or -cfile on the command line,\n");
  fprintf(stderr, "then the comment text is read from standard input.\n");
  fprintf(stderr, "It can be multiple lines, up to %u characters total.\n",
          (unsigned int)MAX_COM_LENGTH);
#ifndef TWO_FILE_COMMANDLINE
  fprintf(stderr, "You must specify an input JPEG file name when supplying\n");
  fprintf(stderr, "comment text from standard input.\n");
#endif

  exit(EXIT_FAILURE);
}